

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O3

void __thiscall wallet::CKeyMetadata::SetNull(CKeyMetadata *this)

{
  long lVar1;
  pointer puVar2;
  uint160 *puVar3;
  base_blob<160U> *pbVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->nVersion = 0xc;
  this->nCreateTime = 0;
  (this->hdKeypath)._M_string_length = 0;
  *(this->hdKeypath)._M_dataplus._M_p = '\0';
  pbVar4 = &(this->hd_seed_id).super_uint160.super_base_blob<160U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  puVar3 = &(this->hd_seed_id).super_uint160;
  (puVar3->super_base_blob<160U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<160U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->hd_seed_id).super_uint160.super_base_blob<160U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  (this->key_origin).fingerprint[0] = '\0';
  (this->key_origin).fingerprint[1] = '\0';
  (this->key_origin).fingerprint[2] = '\0';
  (this->key_origin).fingerprint[3] = '\0';
  puVar2 = (this->key_origin).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->key_origin).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->key_origin).path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  this->has_key_origin = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetNull()
    {
        nVersion = CKeyMetadata::CURRENT_VERSION;
        nCreateTime = 0;
        hdKeypath.clear();
        hd_seed_id.SetNull();
        key_origin.clear();
        has_key_origin = false;
    }